

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IniTest.cpp
# Opt level: O0

void __thiscall TApp_IniOutputVector_Test::TestBody(TApp_IniOutputVector_Test *this)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  bool bVar1;
  char *message;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1f8;
  AssertHelper local_190;
  Message local_188;
  undefined1 local_180 [8];
  AssertionResult gtest_ar;
  string local_168;
  undefined1 local_148 [8];
  string str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  string local_f8 [32];
  string local_d8 [32];
  string local_b8 [32];
  iterator local_98;
  size_type local_90;
  allocator local_81;
  string local_80;
  allocator local_49;
  string local_48;
  undefined1 local_28 [8];
  vector<int,_std::allocator<int>_> v;
  TApp_IniOutputVector_Test *this_local;
  
  v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_end_of_storage
       = (pointer)this;
  CLI::std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_28)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_48,"--vector",&local_49);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_80,"",&local_81);
  CLI::App::add_option<int>
            (&(this->super_TApp).app,&local_48,(vector<int,_std::allocator<int>_> *)local_28,
             &local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  str.field_2._M_local_buf[0xb] = '\x01';
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_118,"--vector",(allocator *)(str.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f8,"1",(allocator *)(str.field_2._M_local_buf + 0xe));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d8,"2",(allocator *)(str.field_2._M_local_buf + 0xd));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b8,"3",(allocator *)(str.field_2._M_local_buf + 0xc));
  str.field_2._M_local_buf[0xb] = '\0';
  local_98 = &local_118;
  local_90 = 4;
  __l._M_len = 4;
  __l._M_array = local_98;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->super_TApp).args,__l);
  local_1f8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_98;
  do {
    local_1f8 = local_1f8 + -1;
    std::__cxx11::string::~string((string *)local_1f8);
  } while (local_1f8 != &local_118);
  std::allocator<char>::~allocator((allocator<char> *)(str.field_2._M_local_buf + 0xc));
  std::allocator<char>::~allocator((allocator<char> *)(str.field_2._M_local_buf + 0xd));
  std::allocator<char>::~allocator((allocator<char> *)(str.field_2._M_local_buf + 0xe));
  std::allocator<char>::~allocator((allocator<char> *)(str.field_2._M_local_buf + 0xf));
  TApp::run(&this->super_TApp);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_168,"",(allocator *)((long)&gtest_ar.message_.ptr_ + 7));
  CLI::App::config_to_str((string *)local_148,&(this->super_TApp).app,false,&local_168);
  std::__cxx11::string::~string((string *)&local_168);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar.message_.ptr_ + 7));
  testing::internal::EqHelper<false>::Compare<char[14],std::__cxx11::string>
            ((EqHelper<false> *)local_180,"\"vector=1 2 3\\n\"","str",
             (char (*) [14])"vector=1 2 3\n",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_148);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_180);
  if (!bVar1) {
    testing::Message::Message(&local_188);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_180);
    testing::internal::AssertHelper::AssertHelper
              (&local_190,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/IniTest.cpp"
               ,0x24c,message);
    testing::internal::AssertHelper::operator=(&local_190,&local_188);
    testing::internal::AssertHelper::~AssertHelper(&local_190);
    testing::Message::~Message(&local_188);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_180);
  std::__cxx11::string::~string((string *)local_148);
  CLI::std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)local_28);
  return;
}

Assistant:

TEST_F(TApp, IniOutputVector) {

    std::vector<int> v;
    app.add_option("--vector", v);

    args = {"--vector", "1", "2", "3"};

    run();

    std::string str = app.config_to_str();
    EXPECT_EQ("vector=1 2 3\n", str);
}